

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2predicates.cc
# Opt level: O0

int s2pred::UnperturbedSign(S2Point *a,S2Point *b,S2Point *c)

{
  Vector3<double> local_40;
  int local_24;
  S2Point *pSStack_20;
  int sign;
  S2Point *c_local;
  S2Point *b_local;
  S2Point *a_local;
  
  pSStack_20 = c;
  c_local = b;
  b_local = a;
  Vector3<double>::CrossProd(&local_40,a,b);
  local_24 = TriageSign(a,b,c,&local_40);
  if (local_24 == 0) {
    local_24 = ExpensiveSign(b_local,c_local,pSStack_20,false);
  }
  return local_24;
}

Assistant:

int UnperturbedSign(const S2Point& a, const S2Point& b, const S2Point& c) {
  int sign = TriageSign(a, b, c, a.CrossProd(b));
  if (sign == 0) sign = ExpensiveSign(a, b, c, false /*perturb*/);
  return sign;
}